

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void schemaIsValid(Parse *pParse)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  Btree *pBt;
  int openedTransaction;
  int rc;
  int iDb;
  sqlite3 *db;
  int cookie;
  BtShared *p;
  undefined4 in_stack_ffffffffffffffd0;
  int wrflag;
  undefined4 uVar3;
  int idx;
  Btree *p_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (Btree *)*in_RDI;
  uVar3 = 0xaaaaaaaa;
  for (idx = 0; idx < *(int *)&p_00->pPrev; idx = idx + 1) {
    wrflag = 0;
    p = (&p_00->pNext->pBt)[(long)idx * 4];
    if (p != (BtShared *)0x0) {
      iVar2 = sqlite3BtreeTxnState((Btree *)p);
      if (iVar2 == 0) {
        iVar2 = sqlite3BtreeBeginTrans((Btree *)CONCAT44(idx,uVar3),wrflag,(int *)p);
        if ((iVar2 == 7) || (iVar2 == 0xc0a)) {
          sqlite3OomFault((sqlite3 *)CONCAT44(wrflag,in_stack_ffffffffffffffd0));
          *(undefined4 *)(in_RDI + 3) = 7;
        }
        if (iVar2 != 0) break;
        wrflag = 1;
        uVar3 = 0;
      }
      iVar2 = (int)((ulong)p >> 0x20);
      sqlite3BtreeGetMeta(p_00,idx,(u32 *)CONCAT44(wrflag,in_stack_ffffffffffffffd0));
      if (**(int **)(&p_00->pNext->nBackup + (long)idx * 8) != -0x55555556) {
        if ((*(ushort *)(*(long *)(&p_00->pNext->nBackup + (long)idx * 8) + 0x72) & 1) == 1) {
          *(undefined4 *)(in_RDI + 3) = 0x11;
        }
        sqlite3ResetOneSchema((sqlite3 *)CONCAT44(wrflag,in_stack_ffffffffffffffd0),iVar2);
      }
      if (wrflag != 0) {
        sqlite3BtreeCommit((Btree *)CONCAT44(wrflag,in_stack_ffffffffffffffd0));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void schemaIsValid(Parse *pParse){
  sqlite3 *db = pParse->db;
  int iDb;
  int rc;
  int cookie;

  assert( pParse->checkSchema );
  assert( sqlite3_mutex_held(db->mutex) );
  for(iDb=0; iDb<db->nDb; iDb++){
    int openedTransaction = 0;         /* True if a transaction is opened */
    Btree *pBt = db->aDb[iDb].pBt;     /* Btree database to read cookie from */
    if( pBt==0 ) continue;

    /* If there is not already a read-only (or read-write) transaction opened
    ** on the b-tree database, open one now. If a transaction is opened, it
    ** will be closed immediately after reading the meta-value. */
    if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_NONE ){
      rc = sqlite3BtreeBeginTrans(pBt, 0, 0);
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        pParse->rc = SQLITE_NOMEM;
      }
      if( rc!=SQLITE_OK ) return;
      openedTransaction = 1;
    }

    /* Read the schema cookie from the database. If it does not match the
    ** value stored as part of the in-memory schema representation,
    ** set Parse.rc to SQLITE_SCHEMA. */
    sqlite3BtreeGetMeta(pBt, BTREE_SCHEMA_VERSION, (u32 *)&cookie);
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    if( cookie!=db->aDb[iDb].pSchema->schema_cookie ){
      if( DbHasProperty(db, iDb, DB_SchemaLoaded) ) pParse->rc = SQLITE_SCHEMA;
      sqlite3ResetOneSchema(db, iDb);
    }

    /* Close the transaction, if one was opened. */
    if( openedTransaction ){
      sqlite3BtreeCommit(pBt);
    }
  }
}